

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

Real __thiscall PeleLM::getCellsCount(PeleLM *this)

{
  bool bVar1;
  FabType FVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  long lVar4;
  MFIter *in_RDI;
  Real count;
  Array4<const_double> vfrac;
  Array4<const_amrex::EBCellFlag> *flag;
  EBCellFlagFab *flagfab;
  EBFArrayBoxFactory *ebfactory;
  Array4<double> *temp;
  Box *bx;
  MFIter mfi;
  MultiFab MFTemp;
  BoxArray *bxs;
  AmrLevel *in_stack_fffffffffffffab0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffab8;
  value_type_conflict1 vVar5;
  anon_class_1_0_00000001 *in_stack_fffffffffffffac0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffac8;
  int nghost;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffad0;
  FabArrayBase *in_stack_fffffffffffffad8;
  int *this_00;
  anon_class_128_2_f0f9b74f *f;
  Box *box;
  MFIter *in_stack_fffffffffffffb10;
  undefined1 local_4e8 [64];
  undefined1 auStack_4a8 [64];
  undefined1 local_468 [56];
  Box *in_stack_fffffffffffffbd0;
  EBCellFlagFab *in_stack_fffffffffffffbd8;
  Array4<const_amrex::EBCellFlag> local_3e8;
  Array4<const_amrex::EBCellFlag> *local_3a8;
  EBCellFlagFab *local_3a0;
  long local_398;
  undefined1 local_390 [64];
  undefined1 *local_350;
  undefined1 local_344 [148];
  undefined1 local_2b0 [440];
  EBCellFlagFab *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  EBCellFlag *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  this_00 = in_RDI[2].tile_size.vect + 2;
  f = (anon_class_128_2_f0f9b74f *)&in_RDI[3].currentIndex;
  local_2b0._24_8_ = 0;
  local_2b0._32_8_ = 0;
  local_2b0._8_8_ = 0;
  local_2b0._16_8_ = 0;
  local_2b0._40_8_ = 0;
  box = (Box *)(local_2b0 + 8);
  amrex::MFInfo::MFInfo((MFInfo *)0x297637);
  local_2b0._0_8_ = 0;
  bxs = (BoxArray *)local_2b0;
  amrex::DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffab0);
  amrex::MultiFab::MultiFab
            ((MultiFab *)this_00,bxs,(DistributionMapping *)in_RDI,
             (int)((ulong)in_stack_fffffffffffffad8 >> 0x20),(int)in_stack_fffffffffffffad8,
             (MFInfo *)in_stack_fffffffffffffad0,(FabFactory<amrex::FArrayBox> *)box);
  amrex::DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x297693);
  amrex::MFInfo::~MFInfo((MFInfo *)0x2976a0);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffab0,(value_type)bxs);
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            (in_RDI,in_stack_fffffffffffffad8,SUB81((ulong)in_stack_fffffffffffffad0 >> 0x38,0));
  while( true ) {
    bVar1 = amrex::MFIter::isValid((MFIter *)(local_344 + 0x24));
    nghost = (int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
    if (!bVar1) {
      amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffab0);
      vVar5 = amrex::ReduceSum<amrex::FArrayBox,PeleLM::getCellsCount()::__2,void>
                        (in_stack_fffffffffffffad0,nghost,in_stack_fffffffffffffac0);
      amrex::ParallelDescriptor::ReduceRealSum<double>((double *)&stack0xfffffffffffffb10);
      amrex::MultiFab::~MultiFab((MultiFab *)0x297c0d);
      return vVar5;
    }
    amrex::MFIter::tilebox(in_stack_fffffffffffffb10);
    local_344._28_8_ = local_344;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffab8,(MFIter *)in_stack_fffffffffffffab0);
    local_350 = local_390;
    pFVar3 = amrex::AmrLevel::Factory(in_stack_fffffffffffffab0);
    lVar4 = __dynamic_cast(pFVar3,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (lVar4 == 0) break;
    local_398 = lVar4;
    amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab
              ((EBFArrayBoxFactory *)in_stack_fffffffffffffab0);
    local_3a0 = amrex::FabArray<amrex::EBCellFlagFab>::operator[]
                          ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffffab0,(MFIter *)bxs
                          );
    local_a8 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).dptr;
    local_b0 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain;
    local_b4 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).nvar;
    local_5c = 0;
    local_88 = (local_b0->smallend).vect[0];
    local_6c = 1;
    iStack_84 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
    local_d0.x = (local_b0->smallend).vect[0];
    local_d0.y = (local_b0->smallend).vect[1];
    local_7c = 2;
    local_d0.z = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    local_8 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_c = 0;
    local_38 = local_8->vect[0] + 1;
    local_18 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_1c = 1;
    iStack_34 = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    local_28 = &(local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
    local_2c = 2;
    local_f0.z = (local_3a0->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_f8 = local_3a0;
    local_dc._0_8_ = local_f0._0_8_;
    local_dc.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    amrex::Array4<const_amrex::EBCellFlag>::Array4(&local_3e8,local_a8,&local_c0,&local_dc,local_b4)
    ;
    local_3a8 = &local_3e8;
    FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
    if (FVar2 == covered) {
      in_stack_fffffffffffffad0 = (FabArray<amrex::FArrayBox> *)local_344._28_8_;
      memcpy(&stack0xfffffffffffffbd8,local_350,0x3c);
      amrex::ParallelFor<PeleLM::getCellsCount()::__0>(box,(anon_class_64_1_8991f0d2 *)f);
    }
    else {
      FVar2 = amrex::EBCellFlagFab::getType(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
      if (FVar2 != regular) {
        amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffffab0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffffab8,(MFIter *)in_stack_fffffffffffffab0);
        in_stack_fffffffffffffac8 = (FabArray<amrex::FArrayBox> *)local_344._28_8_;
        memcpy(local_4e8,local_350,0x3c);
        memcpy(auStack_4a8,local_468,0x3c);
        amrex::ParallelFor<PeleLM::getCellsCount()::__1>(box,f);
      }
    }
    amrex::MFIter::operator++((MFIter *)(local_344 + 0x24));
  }
  __cxa_bad_cast();
}

Assistant:

Real
PeleLM::getCellsCount()
{
#ifdef AMREX_USE_EB
   MultiFab MFTemp(grids,dmap,1,0);
   MFTemp.setVal(1.0);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(MFTemp,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& temp = MFTemp.array(mfi);
      auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
      auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
      auto const& flag    = flagfab.const_array();

      if (flagfab.getType(bx) == FabType::covered) {              // Covered boxes
         amrex::ParallelFor(bx, [temp]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) = 0.0;
         });
      } else if (flagfab.getType(bx) != FabType::regular ) {     // EB containing boxes
         auto vfrac = ebfactory.getVolFrac().const_array(mfi);
         amrex::ParallelFor(bx, [temp,vfrac]
         AMREX_GPU_DEVICE( int i, int j, int k) noexcept
         {
            temp(i,j,k) *= vfrac(i,j,k);
         });
      }
   }

   Real count = amrex::ReduceSum(MFTemp, 0, []
   AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& dat ) noexcept -> Real
   {
      Real r = 0.0;
      AMREX_LOOP_3D(bx,i,j,k,
      {
         r += dat(i,j,k);
      });
      return r;
   });
   ParallelDescriptor::ReduceRealSum(count);

   return count;
#else
   Real count = grids.numPts();
   return count;
#endif
}